

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteStmt.cpp
# Opt level: O0

bool __thiscall hiberlite::SQLiteSelect::step(SQLiteSelect *this)

{
  int result;
  statement_ptr *this_00;
  sqlite3_stmt *pStmt;
  database_error *this_01;
  shared_res<hiberlite::autoclosed_con> local_30;
  int local_1c;
  SQLiteSelect *pSStack_18;
  int rc;
  SQLiteSelect *this_local;
  
  pSStack_18 = this;
  this_00 = shared_res<hiberlite::statement_ptr>::operator->(&this->statement);
  pStmt = statement_ptr::get_stmt(this_00);
  result = sqlite3_step(pStmt);
  if (result == 0x65) {
    this_local._7_1_ = false;
  }
  else {
    if (result != 100) {
      local_1c = result;
      shared_res<hiberlite::autoclosed_con>::shared_res(&local_30,&this->con);
      database_error::database_assert(result,&local_30);
      shared_res<hiberlite::autoclosed_con>::~shared_res(&local_30);
      this_01 = (database_error *)__cxa_allocate_exception(0x10);
      database_error::database_error(this_01,"really strange - sqlite3_step returns SQLITE_OK");
      __cxa_throw(this_01,&database_error::typeinfo,database_error::~database_error);
    }
    this->active = true;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SQLiteSelect::step()
{
	int rc=sqlite3_step(statement->get_stmt());
	if(rc==SQLITE_DONE)
		return false;
	if(rc==SQLITE_ROW){
		active=true;
		return true;
	}
	database_error::database_assert(rc, con);
	throw database_error("really strange - sqlite3_step returns SQLITE_OK");
}